

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

char __thiscall Omega_h::Write<signed_char>::get(Write<signed_char> *this,LO i)

{
  char cVar1;
  ScopedTimer timer;
  ScopedTimer local_11;
  
  begin_code("single device to host",(char *)0x0);
  cVar1 = *(char *)((long)(this->shared_alloc_).direct_ptr + (long)i);
  ScopedTimer::~ScopedTimer(&local_11);
  return cVar1;
}

Assistant:

T Write<T>::get(LO i) const {
  ScopedTimer timer("single device to host");
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK(0 <= i);
    OMEGA_H_CHECK(i < size());
#endif
#ifdef OMEGA_H_USE_CUDA
  T value;
  cudaMemcpy(&value, data() + i, sizeof(T), cudaMemcpyDeviceToHost);
  return value;
#else
  return operator[](i);
#endif
}